

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_particleSpectra.cpp
# Opt level: O0

void __thiscall
singleParticleSpectra::calculate_three_particle_correlation_deltaeta
          (singleParticleSpectra *this,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Q1_real,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Q1_imag,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Q2_real,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Q2_imag,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Q3_real,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Q3_imag,int flag,int flag_ch,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *corr_rap,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *corr_rap_err)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  int iVar6;
  ulong uVar7;
  reference pvVar8;
  reference pvVar9;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_RCX;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_RDX;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_RSI;
  long in_RDI;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_R8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_R9;
  double dVar10;
  double dVar11;
  double dVar12;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_00000020;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_00000028;
  int kk_1;
  double corr_local_1;
  double corr_local;
  double Qk_Qkstar;
  double Qm_Qmstar;
  double Qn_Qnstar;
  double Qn_Qm_Qkstar;
  int rap_idx;
  int jj;
  int ii;
  int kk;
  int j_1;
  int j;
  double Q3_imag;
  double Q3_real;
  double Q2_imag;
  double Q2_real;
  int k;
  int i;
  double *temp_corr;
  int m [9];
  int n [9];
  char (*in_stack_fffffffffffffd78) [53];
  pretty_ostream *in_stack_fffffffffffffd80;
  string *in_stack_fffffffffffffe98;
  pretty_ostream *in_stack_fffffffffffffea0;
  int local_13c;
  double local_138;
  double local_130;
  double local_128;
  double local_120;
  int local_104;
  int local_100;
  int local_fc;
  int local_f8;
  int local_f4;
  double local_f0;
  double local_e8;
  double local_e0;
  double local_d8;
  allocator local_b9;
  string local_b8 [32];
  int local_98;
  int local_94;
  void *local_90;
  int local_88 [12];
  int local_58 [10];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_30;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_28;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_20;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_18;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_10;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  memcpy(local_58,&DAT_001b1170,0x24);
  memcpy(local_88,&DAT_001b11a0,0x24);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (long)*(int *)(in_RDI + 0x254);
  uVar7 = SUB168(auVar5 * ZEXT816(8),0);
  if (SUB168(auVar5 * ZEXT816(8),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  local_90 = operator_new__(uVar7);
  local_94 = 0;
  while( true ) {
    if (*(int *)(in_RDI + 0x538) <= local_94) {
      if (local_90 != (void *)0x0) {
        operator_delete__(local_90);
      }
      return;
    }
    local_98 = local_58[local_94] + local_88[local_94];
    if (*(int *)(in_RDI + 0x1c8) < local_98) break;
    local_d8 = 0.0;
    local_e0 = 0.0;
    local_e8 = 0.0;
    local_f0 = 0.0;
    if (in_stack_00000010 == 1) {
      for (local_f4 = 0; local_f4 < *(int *)(in_RDI + 0x254); local_f4 = local_f4 + 1) {
        pvVar8 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](local_30,(long)local_f4);
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](pvVar8,(long)local_98);
        local_e8 = *pvVar9 + local_e8;
        pvVar8 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](in_stack_00000008,(long)local_f4);
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](pvVar8,(long)local_98);
        local_f0 = *pvVar9 + local_f0;
      }
    }
    else if (in_stack_00000010 == 2) {
      for (local_f8 = 0; local_f8 < *(int *)(in_RDI + 0x254); local_f8 = local_f8 + 1) {
        pvVar8 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](local_20,(long)local_f8);
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](pvVar8,(long)local_98);
        local_d8 = *pvVar9 + local_d8;
        pvVar8 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](local_28,(long)local_f8);
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](pvVar8,(long)local_98);
        local_e0 = *pvVar9 + local_e0;
      }
    }
    for (local_fc = 0; local_fc < *(int *)(in_RDI + 0x254); local_fc = local_fc + 1) {
      *(undefined8 *)((long)local_90 + (long)local_fc * 8) = 0;
    }
    for (local_100 = 0; local_100 < *(int *)(in_RDI + 0x254); local_100 = local_100 + 1) {
      for (local_104 = 0; local_104 < *(int *)(in_RDI + 0x254); local_104 = local_104 + 1) {
        iVar6 = (local_100 - local_104) -
                (int)(*(double *)(in_RDI + 600) / *(double *)(in_RDI + 0x268));
        if ((-1 < iVar6) && (iVar6 < *(int *)(in_RDI + 0x254))) {
          local_120 = 0.0;
          local_128 = 0.0;
          if (in_stack_00000010 == 1) {
            pvVar8 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[](local_10,(long)local_100);
            pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                               (pvVar8,(long)local_58[local_94]);
            dVar12 = *pvVar9;
            pvVar8 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[](local_20,(long)local_104);
            pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                               (pvVar8,(long)local_88[local_94]);
            dVar11 = *pvVar9;
            pvVar8 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[](local_18,(long)local_100);
            pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                               (pvVar8,(long)local_58[local_94]);
            dVar1 = *pvVar9;
            pvVar8 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[](local_28,(long)local_104);
            pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                               (pvVar8,(long)local_88[local_94]);
            dVar10 = *pvVar9;
            pvVar8 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[](local_10,(long)local_100);
            pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                               (pvVar8,(long)local_58[local_94]);
            dVar2 = *pvVar9;
            pvVar8 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[](local_28,(long)local_104);
            pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                               (pvVar8,(long)local_88[local_94]);
            dVar3 = *pvVar9;
            pvVar8 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[](local_18,(long)local_100);
            pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                               (pvVar8,(long)local_58[local_94]);
            dVar4 = *pvVar9;
            pvVar8 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[](local_20,(long)local_104);
            pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                               (pvVar8,(long)local_88[local_94]);
            dVar10 = (dVar12 * dVar11 + -(dVar1 * dVar10)) * local_e8 +
                     (dVar2 * dVar3 + dVar4 * *pvVar9) * local_f0;
            pvVar8 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[](local_10,(long)local_100);
            pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                               (pvVar8,(long)local_58[local_94]);
            dVar12 = *pvVar9;
            pvVar8 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[](local_20,(long)local_104);
            pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                               (pvVar8,(long)local_58[local_94]);
            dVar11 = *pvVar9;
            pvVar8 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[](local_18,(long)local_100);
            pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                               (pvVar8,(long)local_58[local_94]);
            dVar1 = *pvVar9;
            pvVar8 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[](local_28,(long)local_104);
            pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                               (pvVar8,(long)local_58[local_94]);
            dVar11 = dVar12 * dVar11 + dVar1 * *pvVar9;
            pvVar8 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[](local_20,(long)local_100);
            pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                               (pvVar8,(long)local_88[local_94]);
            in_stack_fffffffffffffe98 = (string *)*pvVar9;
            pvVar8 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[](local_10,(long)local_104);
            pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                               (pvVar8,(long)local_88[local_94]);
            in_stack_fffffffffffffea0 = (pretty_ostream *)*pvVar9;
            pvVar8 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[](local_28,(long)local_100);
            pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                               (pvVar8,(long)local_88[local_94]);
            dVar12 = *pvVar9;
            pvVar8 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[](local_18,(long)local_104);
            pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                               (pvVar8,(long)local_88[local_94]);
            local_130 = (double)in_stack_fffffffffffffe98 * (double)in_stack_fffffffffffffea0 +
                        dVar12 * *pvVar9;
            if ((local_100 == local_104) && (in_stack_00000018 == 1)) {
              pvVar8 = std::
                       vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ::operator[](local_10,(long)local_100);
              pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (pvVar8,(long)local_98);
              dVar12 = *pvVar9;
              pvVar8 = std::
                       vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ::operator[](local_18,(long)local_100);
              pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (pvVar8,(long)local_98);
              local_128 = dVar12 * local_e8 + *pvVar9 * local_f0;
            }
            if (1e-15 <= ABS(local_128)) {
              pvVar8 = std::
                       vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ::operator[](local_10,(long)local_100);
              pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](pvVar8,0);
              local_130 = *pvVar9 + *pvVar9 + (((dVar10 - dVar11) - local_130) - local_128);
            }
            else {
              local_130 = (dVar10 - dVar11) - local_130;
            }
            *(double *)((long)local_90 + (long)iVar6 * 8) =
                 local_130 + *(double *)((long)local_90 + (long)iVar6 * 8);
          }
          else if (in_stack_00000010 == 2) {
            pvVar8 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[](local_10,(long)local_100);
            pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                               (pvVar8,(long)local_58[local_94]);
            dVar12 = *pvVar9;
            pvVar8 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[](local_18,(long)local_100);
            pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                               (pvVar8,(long)local_58[local_94]);
            dVar11 = *pvVar9;
            pvVar8 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[](local_30,(long)local_104);
            pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](pvVar8,(long)local_98)
            ;
            dVar1 = *pvVar9;
            pvVar8 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[](local_10,(long)local_100);
            pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                               (pvVar8,(long)local_58[local_94]);
            dVar10 = *pvVar9;
            pvVar8 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[](local_18,(long)local_100);
            pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                               (pvVar8,(long)local_58[local_94]);
            dVar2 = *pvVar9;
            pvVar8 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[](in_stack_00000008,(long)local_104);
            pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](pvVar8,(long)local_98)
            ;
            dVar10 = (dVar12 * local_d8 + -(dVar11 * local_e0)) * dVar1 +
                     (dVar10 * local_e0 + dVar2 * local_d8) * *pvVar9;
            pvVar8 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[](local_10,(long)local_100);
            pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                               (pvVar8,(long)local_58[local_94]);
            dVar12 = *pvVar9;
            pvVar8 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[](local_20,(long)local_104);
            pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                               (pvVar8,(long)local_58[local_94]);
            dVar11 = *pvVar9;
            pvVar8 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[](local_18,(long)local_100);
            pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                               (pvVar8,(long)local_58[local_94]);
            dVar1 = *pvVar9;
            pvVar8 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[](local_28,(long)local_104);
            pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                               (pvVar8,(long)local_58[local_94]);
            dVar12 = dVar12 * dVar11 + dVar1 * *pvVar9;
            if (local_100 == local_104) {
              pvVar8 = std::
                       vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ::operator[](local_10,(long)local_104);
              pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (pvVar8,(long)local_88[local_94]);
              dVar11 = *pvVar9;
              pvVar8 = std::
                       vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ::operator[](local_18,(long)local_104);
              pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (pvVar8,(long)local_88[local_94]);
              local_120 = local_d8 * dVar11 + local_e0 * *pvVar9;
            }
            if (in_stack_00000018 == 1) {
              pvVar8 = std::
                       vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ::operator[](local_10,(long)local_100);
              pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (pvVar8,(long)local_98);
              dVar11 = *pvVar9;
              pvVar8 = std::
                       vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ::operator[](local_30,(long)local_104);
              pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (pvVar8,(long)local_98);
              dVar1 = *pvVar9;
              pvVar8 = std::
                       vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ::operator[](local_18,(long)local_100);
              pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (pvVar8,(long)local_98);
              dVar2 = *pvVar9;
              pvVar8 = std::
                       vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ::operator[](in_stack_00000008,(long)local_104);
              pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (pvVar8,(long)local_98);
              local_128 = dVar11 * dVar1 + dVar2 * *pvVar9;
            }
            if ((ABS(local_128) <= 1e-15) || (ABS(local_120) <= 1e-15)) {
              local_138 = ((dVar10 - dVar12) - local_120) - local_128;
            }
            else {
              pvVar8 = std::
                       vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ::operator[](local_10,(long)local_100);
              pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](pvVar8,0);
              local_138 = *pvVar9 + *pvVar9 + (((dVar10 - dVar12) - local_120) - local_128);
            }
            *(double *)((long)local_90 + (long)iVar6 * 8) =
                 local_138 + *(double *)((long)local_90 + (long)iVar6 * 8);
          }
        }
      }
    }
    for (local_13c = 0; local_13c < *(int *)(in_RDI + 0x254); local_13c = local_13c + 1) {
      in_stack_fffffffffffffd80 = *(pretty_ostream **)((long)local_90 + (long)local_13c * 8);
      pvVar8 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](in_stack_00000020,(long)local_94);
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](pvVar8,(long)local_13c);
      *pvVar9 = (double)in_stack_fffffffffffffd80 + *pvVar9;
      dVar12 = *(double *)((long)local_90 + (long)local_13c * 8);
      dVar11 = *(double *)((long)local_90 + (long)local_13c * 8);
      pvVar8 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](in_stack_00000028,(long)local_94);
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](pvVar8,(long)local_13c);
      *pvVar9 = dVar12 * dVar11 + *pvVar9;
    }
    local_94 = local_94 + 1;
  }
  pretty_ostream::operator<<(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  pretty_ostream::operator<<(in_stack_fffffffffffffd80,(char (*) [30])in_stack_fffffffffffffd78);
  pretty_ostream::operator<<(in_stack_fffffffffffffd80,(int *)in_stack_fffffffffffffd78);
  pretty_ostream::operator<<(in_stack_fffffffffffffd80,(char (*) [7])in_stack_fffffffffffffd78);
  pretty_ostream::operator<<(in_stack_fffffffffffffd80,(int *)in_stack_fffffffffffffd78);
  pretty_ostream::operator<<(in_stack_fffffffffffffd80,(char (*) [29])in_stack_fffffffffffffd78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"error",&local_b9);
  pretty_ostream::flush(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  exit(1);
}

Assistant:

void singleParticleSpectra::calculate_three_particle_correlation_deltaeta(
    vector<vector<double>> &event_Q1_real,
    vector<vector<double>> &event_Q1_imag,
    vector<vector<double>> &event_Q2_real,
    vector<vector<double>> &event_Q2_imag,
    vector<vector<double>> &event_Q3_real,
    vector<vector<double>> &event_Q3_imag, int flag, int flag_ch,
    vector<vector<double>> &corr_rap, vector<vector<double>> &corr_rap_err) {
    // C_nmk[0] = C_000 = N(N-1)(N-2) is the number of pairs
    // C_nmk[1] = C_112, C_nmk[2] = C_123, C_nmk[3] = C_224, C_nmk[4] = C_235
    // C_nmk[5] = C_134, C_nmk[6] = C_246, C_nmk[7] = C_336, C_nmk[8] = C_347
    int n[9] = {0, 1, 1, 2, 2, 1, 2, 3, 3};
    int m[9] = {0, 1, 2, 2, 3, 3, 4, 3, 4};
    double *temp_corr = new double[N_rap];
    for (int i = 0; i < num_corr; i++) {
        int k = n[i] + m[i];
        if (k > order_max) {
            messager << "Error: the vn needed for three-particle correlation "
                     << "is not computed, order_max = " << order_max
                     << "n+m = " << k << ". Make sure order_max > n+m!";
            messager.flush("error");
            exit(1);
        }

        double Q2_real = 0.0;
        double Q2_imag = 0.0;
        double Q3_real = 0.0;
        double Q3_imag = 0.0;
        if (flag == 1) {
            for (int j = 0; j < N_rap; j++) {
                Q3_real += event_Q3_real[j][k];
                Q3_imag += event_Q3_imag[j][k];
            }
        } else if (flag == 2) {
            for (int j = 0; j < N_rap; j++) {
                Q2_real += event_Q2_real[j][k];
                Q2_imag += event_Q2_imag[j][k];
            }
        }

        for (int kk = 0; kk < N_rap; kk++) {
            temp_corr[kk] = 0.0;
        }
        for (int ii = 0; ii < N_rap; ii++) {
            for (int jj = 0; jj < N_rap; jj++) {
                int rap_idx =
                    ((ii - jj) - static_cast<int>(rapidity_dis_min / drap));
                if (rap_idx >= 0 && rap_idx < N_rap) {
                    double Qn_Qm_Qkstar = 0.0;
                    double Qn_Qnstar = 0.0;
                    double Qm_Qmstar = 0.0;
                    double Qk_Qkstar = 0.0;
                    if (flag == 1) {
                        Qn_Qm_Qkstar =
                            ((event_Q1_real[ii][n[i]] * event_Q2_real[jj][m[i]]
                              - event_Q1_imag[ii][n[i]]
                                    * event_Q2_imag[jj][m[i]])
                                 * Q3_real
                             + (event_Q1_real[ii][n[i]]
                                    * event_Q2_imag[jj][m[i]]
                                + event_Q1_imag[ii][n[i]]
                                      * event_Q2_real[jj][m[i]])
                                   * Q3_imag);
                        // full overlap between Q2 and Q3 = Q1[n]*conj(Q2[n])
                        Qn_Qnstar =
                            (event_Q1_real[ii][n[i]] * event_Q2_real[jj][n[i]]
                             + event_Q1_imag[ii][n[i]]
                                   * event_Q2_imag[jj][n[i]]);
                        // full overlap between Q1 and Q3 = Q2[m]*conj(Q1[m])
                        Qm_Qmstar =
                            (event_Q2_real[ii][m[i]] * event_Q1_real[jj][m[i]]
                             + event_Q2_imag[ii][m[i]]
                                   * event_Q1_imag[jj][m[i]]);
                        // full overlap between Q1 and Q2 = Q1[k]*conj(Q3[k])
                        if (ii == jj && flag_ch == 1) {
                            Qk_Qkstar =
                                (event_Q1_real[ii][k] * Q3_real
                                 + event_Q1_imag[ii][k] * Q3_imag);
                        }
                        double corr_local;
                        if (fabs(Qk_Qkstar) < 1e-15) {
                            corr_local = Qn_Qm_Qkstar - Qn_Qnstar - Qm_Qmstar;
                        } else {
                            corr_local =
                                (Qn_Qm_Qkstar - Qn_Qnstar - Qm_Qmstar
                                 - Qk_Qkstar + 2. * event_Q1_real[ii][0]);
                        }
                        temp_corr[rap_idx] += corr_local;
                    } else if (flag == 2) {
                        Qn_Qm_Qkstar =
                            ((event_Q1_real[ii][n[i]] * Q2_real
                              - event_Q1_imag[ii][n[i]] * Q2_imag)
                                 * event_Q3_real[jj][k]
                             + (event_Q1_real[ii][n[i]] * Q2_imag
                                + event_Q1_imag[ii][n[i]] * Q2_real)
                                   * event_Q3_imag[jj][k]);
                        // full overlap between Q2 and Q3 = Q1[n]*conj(Q2[n])
                        Qn_Qnstar =
                            (event_Q1_real[ii][n[i]] * event_Q2_real[jj][n[i]]
                             + event_Q1_imag[ii][n[i]]
                                   * event_Q2_imag[jj][n[i]]);
                        // full overlap between Q1 and Q3 = Q2[m]*conj(Q1[m])
                        if (ii == jj) {
                            Qm_Qmstar =
                                (Q2_real * event_Q1_real[jj][m[i]]
                                 + Q2_imag * event_Q1_imag[jj][m[i]]);
                        }
                        // full overlap between Q1 and Q2 = Q1[k]*conj(Q3[k])
                        if (flag_ch == 1) {
                            Qk_Qkstar =
                                (event_Q1_real[ii][k] * event_Q3_real[jj][k]
                                 + event_Q1_imag[ii][k] * event_Q3_imag[jj][k]);
                        }

                        double corr_local;
                        if (fabs(Qk_Qkstar) > 1e-15
                            && fabs(Qm_Qmstar) > 1e-15) {
                            corr_local =
                                (Qn_Qm_Qkstar - Qn_Qnstar - Qm_Qmstar
                                 - Qk_Qkstar + 2. * event_Q1_real[ii][0]);
                        } else {
                            corr_local =
                                (Qn_Qm_Qkstar - Qn_Qnstar - Qm_Qmstar
                                 - Qk_Qkstar);
                        }
                        temp_corr[rap_idx] += corr_local;
                    }
                }
            }
        }
        for (int kk = 0; kk < N_rap; kk++) {
            corr_rap[i][kk] += temp_corr[kk];
            corr_rap_err[i][kk] += temp_corr[kk] * temp_corr[kk];
        }
    }
    delete[] temp_corr;
}